

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O3

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
MessageSetNonCanonInvalidTypeId<proto2_unittest::TestAllTypes>::~MessageSetNonCanonInvalidTypeId
          (MessageSetNonCanonInvalidTypeId<proto2_unittest::TestAllTypes> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, MessageSetNonCanonInvalidTypeId) {
  // "type_id" is 0 and should fail to parse. uint8_t is used to silence
  // complaints about narrowing conversion.
  const uint8_t encoded[] = {
      013,                               // 1: SGROUP
      032, 0,                            // 3:LEN 0
      020, 0x80, 0x80, 0x80, 0x80, 020,  // 2: long-form:2 0
      014                                // 1: EGROUP
  };
  typename TestFixture::TestMessageSet message;
  EXPECT_FALSE(message.ParseFromArray(encoded, sizeof(encoded)));
}